

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Body.h
# Opt level: O2

Body * __thiscall RigidBodyDynamics::Body::operator=(Body *this,Body *body)

{
  if (this != body) {
    this->mMass = body->mMass;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>>
              (&(this->mInertia).super_Matrix3d,&(body->mInertia).super_Matrix3d);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Matrix<double,3,1,0,3,1>>
              (&(this->mCenterOfMass).super_Vector3d,&(body->mCenterOfMass).super_Vector3d);
    this->mIsVirtual = body->mIsVirtual;
  }
  return this;
}

Assistant:

Body& operator= (const Body &body)
  {
    if (this != &body) {
      mMass = body.mMass;
      mInertia = body.mInertia;
      mCenterOfMass = body.mCenterOfMass;
      mIsVirtual = body.mIsVirtual;
    }

    return *this;
  }